

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

void resolve_identity_backlink_update(lys_ident *der,lys_ident *base)

{
  ly_set *plVar1;
  ulong uVar2;
  
  if ((der != (lys_ident *)0x0) && (base != (lys_ident *)0x0)) {
    if (base->der == (ly_set *)0x0) {
      plVar1 = ly_set_new();
      base->der = plVar1;
    }
    ly_set_add(base->der,der,1);
    if (base->base_size != '\0') {
      uVar2 = 0;
      do {
        resolve_identity_backlink_update(der,base->base[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar2 < base->base_size);
    }
    return;
  }
  __assert_fail("der && base",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                ,0x15f5,
                "void resolve_identity_backlink_update(struct lys_ident *, struct lys_ident *)");
}

Assistant:

void
resolve_identity_backlink_update(struct lys_ident *der, struct lys_ident *base)
{
    int i;

    assert(der && base);

    if (!base->der) {
        /* create a set for backlinks if it does not exist */
        base->der = ly_set_new();
    }
    /* store backlink */
    ly_set_add(base->der, der, LY_SET_OPT_USEASLIST);

    /* do it recursively */
    for (i = 0; i < base->base_size; i++) {
        resolve_identity_backlink_update(der, base->base[i]);
    }
}